

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O3

void __thiscall
CLI::RequiredError::RequiredError(RequiredError *this,string *msg,ExitCodes exit_code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"RequiredError","");
  local_68._M_dataplus._M_p = (msg->_M_dataplus)._M_p;
  paVar1 = &msg->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&msg->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68._M_string_length = msg->_M_string_length;
  (msg->_M_dataplus)._M_p = (pointer)paVar1;
  msg->_M_string_length = 0;
  (msg->field_2)._M_local_buf[0] = '\0';
  ParseError::ParseError(&this->super_ParseError,&local_48,&local_68,exit_code);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__Error_00206260;
  return;
}

Assistant:

static RequiredError Subcommand(std::size_t min_subcom) {
        if(min_subcom == 1) {
            return RequiredError("A subcommand");
        }
        return {"Requires at least " + std::to_string(min_subcom) + " subcommands", ExitCodes::RequiredError};
    }